

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O2

void Sat_MemAlloc_(Sat_Mem_t *p,int nPageSize)

{
  uint uVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  size_t __size;
  
  p->BookMarkE[0] = 0;
  p->BookMarkE[1] = 0;
  p->nEntries[0] = 0;
  p->nEntries[1] = 0;
  p->BookMarkH[0] = 0;
  p->BookMarkH[1] = 0;
  p->nPageSize = nPageSize;
  uVar1 = 1 << ((byte)nPageSize & 0x1f);
  p->uLearnedMask = uVar1;
  p->uPageMask = uVar1 - 1;
  p->nPagesAlloc = 0x100;
  ppiVar2 = (int **)calloc(0x100,8);
  p->pPages = ppiVar2;
  __size = (0x100000000 << ((byte)nPageSize & 0x3f)) >> 0x1e;
  piVar3 = (int *)malloc(__size);
  *ppiVar2 = piVar3;
  piVar4 = (int *)malloc(__size);
  ppiVar2[1] = piVar4;
  p->iPage[0] = 0;
  p->iPage[1] = 1;
  *piVar3 = 2;
  *piVar4 = 2;
  return;
}

Assistant:

static inline void Sat_MemAlloc_( Sat_Mem_t * p, int nPageSize )
{
    assert( nPageSize > 8 && nPageSize < 32 );
    memset( p, 0, sizeof(Sat_Mem_t) );
    p->nPageSize    = nPageSize;
    p->uLearnedMask = (unsigned)(1 << nPageSize);
    p->uPageMask    = (unsigned)((1 << nPageSize) - 1);
    p->nPagesAlloc  = 256;
    p->pPages       = ABC_CALLOC( int *, p->nPagesAlloc );
    p->pPages[0]    = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
    p->pPages[1]    = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
    p->iPage[0]     = 0;
    p->iPage[1]     = 1;
    Sat_MemWriteLimit( p->pPages[0], 2 );
    Sat_MemWriteLimit( p->pPages[1], 2 );
}